

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_get_fibre_channel_media(tcv_t *tcv,tcv_fibre_channel_media_t *media)

{
  _Bool _Var1;
  uint local_24;
  int ret;
  tcv_fibre_channel_media_t *media_local;
  tcv_t *tcv_local;
  
  _Var1 = tcv_check_and_lock_ok(tcv);
  if ((_Var1) && (media != (tcv_fibre_channel_media_t *)0x0)) {
    _Var1 = tcv_is_initialized(tcv);
    local_24 = (uint)_Var1;
    if (local_24 != 0) {
      local_24 = (*tcv->fun->get_fibre_channel_media)(tcv,media);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_24;
  }
  else {
    tcv_local._4_4_ = 0xfffffffc;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_get_fibre_channel_media(tcv_t *tcv, tcv_fibre_channel_media_t *media)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !media)
		return TCV_ERR_INVALID_ARG;

	ret = tcv_is_initialized(tcv);
	if (ret) {
		ret = tcv->fun->get_fibre_channel_media(tcv, media);
	}

	tcv_unlock(tcv);
	return ret;
}